

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O3

void __thiscall
duckdb::TemporaryDirectoryHandle::TemporaryDirectoryHandle
          (TemporaryDirectoryHandle *this,DatabaseInstance *db,string *path_p,
          atomic<unsigned_long> *size_on_disk,optional_idx max_swap_space)

{
  string *temp_directory_p;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  int iVar5;
  _Head_base<0UL,_duckdb::TemporaryFileManager_*,_false> this_00;
  FileSystem *pFVar6;
  pointer this_01;
  pointer *__ptr;
  
  this->db = db;
  temp_directory_p = &this->temp_directory;
  paVar1 = &(this->temp_directory).field_2;
  (this->temp_directory)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (path_p->_M_dataplus)._M_p;
  paVar2 = &path_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&path_p->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->temp_directory).field_2 + 8) = uVar4;
  }
  else {
    (temp_directory_p->_M_dataplus)._M_p = pcVar3;
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->temp_directory)._M_string_length = path_p->_M_string_length;
  (path_p->_M_dataplus)._M_p = (pointer)paVar2;
  path_p->_M_string_length = 0;
  (path_p->field_2)._M_local_buf[0] = '\0';
  this->created_directory = false;
  this_00._M_head_impl = (TemporaryFileManager *)operator_new(0x1b10);
  TemporaryFileManager::TemporaryFileManager(this_00._M_head_impl,db,temp_directory_p,size_on_disk);
  (this->temp_file).
  super_unique_ptr<duckdb::TemporaryFileManager,_std::default_delete<duckdb::TemporaryFileManager>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::TemporaryFileManager,_std::default_delete<duckdb::TemporaryFileManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::TemporaryFileManager_*,_std::default_delete<duckdb::TemporaryFileManager>_>
  .super__Head_base<0UL,_duckdb::TemporaryFileManager_*,_false>._M_head_impl = this_00._M_head_impl;
  pFVar6 = FileSystem::GetFileSystem(db);
  iVar5 = (*pFVar6->_vptr_FileSystem[0xd])(pFVar6,temp_directory_p,0);
  if ((char)iVar5 == '\0') {
    (*pFVar6->_vptr_FileSystem[0xe])(pFVar6,temp_directory_p,0);
    this->created_directory = true;
  }
  this_01 = unique_ptr<duckdb::TemporaryFileManager,_std::default_delete<duckdb::TemporaryFileManager>,_true>
            ::operator->(&this->temp_file);
  TemporaryFileManager::SetMaxSwapSpace(this_01,max_swap_space);
  return;
}

Assistant:

TemporaryDirectoryHandle::TemporaryDirectoryHandle(DatabaseInstance &db, string path_p, atomic<idx_t> &size_on_disk,
                                                   optional_idx max_swap_space)
    : db(db), temp_directory(std::move(path_p)),
      temp_file(make_uniq<TemporaryFileManager>(db, temp_directory, size_on_disk)) {
	auto &fs = FileSystem::GetFileSystem(db);
	D_ASSERT(!temp_directory.empty());
	if (!fs.DirectoryExists(temp_directory)) {
		fs.CreateDirectory(temp_directory);
		created_directory = true;
	}
	temp_file->SetMaxSwapSpace(max_swap_space);
}